

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeedForwardNN.h
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
nnad::FeedForwardNN<double>::GetParameters
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          FeedForwardNN<double> *this)

{
  pointer pdVar1;
  pointer pdVar2;
  int iVar3;
  pointer piVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  double dVar9;
  uint local_44;
  int local_40;
  int local_3c;
  map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
  *local_38;
  
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(long)this->_NpPrep + (long)this->_Np,
             (allocator_type *)&local_44);
  piVar4 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (ulong)((long)(this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar4) >> 2;
  local_38 = &this->_Biases;
  lVar8 = 0;
  while( true ) {
    iVar3 = (int)uVar6;
    local_44 = iVar3 - 1;
    uVar6 = (ulong)local_44;
    if (iVar3 < 2) break;
    for (local_3c = 0; local_3c < piVar4[(int)uVar6]; local_3c = local_3c + 1) {
      pmVar5 = std::
               map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
               ::at(local_38,(key_type *)&local_44);
      local_40 = 0;
      dVar9 = Matrix<double>::GetElement(pmVar5,&local_3c,&local_40);
      lVar8 = (long)(int)lVar8;
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar8] = dVar9;
      local_40 = 0;
      while( true ) {
        lVar8 = lVar8 + 1;
        uVar6 = (ulong)(int)local_44;
        piVar4 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (piVar4[uVar6 - 1] <= local_40) break;
        pmVar5 = std::
                 map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
                 ::at(&this->_Links,(key_type *)&local_44);
        dVar9 = Matrix<double>::GetElement(pmVar5,&local_3c,&local_40);
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar8] = dVar9;
        local_40 = local_40 + 1;
      }
    }
  }
  pdVar1 = (this->_PreprocPars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = 0;
  uVar6 = (ulong)(uint)this->_NpPrep;
  if (this->_NpPrep < 1) {
    uVar6 = uVar7;
  }
  pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    pdVar2[(long)(int)lVar8 + uVar7] = pdVar1[uVar7];
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> GetParameters() const
    {
      // Initialise output vector
      std::vector<T> output(_Np + _NpPrep);

      // Element counter
      int count = 0;

      // Number of layers
      const int nl = (int) _Arch.size();

      // Neural network parameters
      for (int l = nl - 1; l > 0; l--)
        for (int i = 0; i < _Arch[l]; i++)
          {
            // Biases
            output[count++] = _Biases.at(l).GetElement(i, 0);

            // Links
            for (int j = 0; j < _Arch[l - 1]; j++)
              output[count++] = _Links.at(l).GetElement(i, j);
          }

      // Preprocessing parameters
      for (int ip = 0; ip < _NpPrep; ip++)
        output[count++] = _PreprocPars[ip];

      return output;
    }